

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# env_posix.cc
# Opt level: O0

void __thiscall
leveldb::anon_unknown_1::PosixRandomAccessFile::~PosixRandomAccessFile(PosixRandomAccessFile *this)

{
  PosixRandomAccessFile *this_local;
  
  ~PosixRandomAccessFile(this);
  operator_delete(this);
  return;
}

Assistant:

virtual Status Read(uint64_t offset, size_t n, Slice *result,
                                char *scratch) const {
                Status s;
                ssize_t r = pread(fd_, scratch, n, static_cast<off_t>(offset));
                *result = Slice(scratch, (r < 0) ? 0 : r);
                if (r < 0) {
                    // An error: return a non-ok status
                    s = IOError(filename_, errno);
                }
                return s;
            }